

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

pair<google::protobuf::Map<long,_double>::InnerMap::iterator_base<google::protobuf::Map<long,_double>::KeyValuePair>,_bool>
* __thiscall
google::protobuf::Map<long,_double>::InnerMap::insert
          (pair<google::protobuf::Map<long,_double>::InnerMap::iterator_base<google::protobuf::Map<long,_double>::KeyValuePair>,_bool>
           *__return_storage_ptr__,InnerMap *this,KeyValuePair *kv)

{
  value_type *pvVar1;
  unsigned_long b;
  bool bVar2;
  Node *node;
  pair<google::protobuf::Map<long,_double>::InnerMap::iterator_base<const_google::protobuf::Map<long,_double>::KeyValuePair>,_unsigned_long>
  p;
  pair<google::protobuf::Map<long,_double>::InnerMap::iterator_base<const_google::protobuf::Map<long,_double>::KeyValuePair>,_unsigned_long>
  local_40;
  
  FindHelper(&p,this,&kv->k_);
  if (p.first.node_ == (Node *)0x0) {
    bVar2 = ResizeIfLoadIsOutOfRange(this,this->num_elements_ + 1);
    if (bVar2) {
      FindHelper(&local_40,this,&kv->k_);
      p.first.bucket_index_ = local_40.first.bucket_index_;
      p.first.node_ = local_40.first.node_;
      p.first.m_ = local_40.first.m_;
      p.second = local_40.second;
    }
    b = p.second;
    node = Map<long,double>::InnerMap::Alloc<google::protobuf::Map<long,double>::InnerMap::Node>
                     ((InnerMap *)this,1);
    pvVar1 = kv->v_;
    (node->kv).k_ = kv->k_;
    (node->kv).v_ = pvVar1;
    InsertUnique(&__return_storage_ptr__->first,this,b,node);
    this->num_elements_ = this->num_elements_ + 1;
    bVar2 = true;
  }
  else {
    (__return_storage_ptr__->first).node_ = p.first.node_;
    (__return_storage_ptr__->first).m_ = p.first.m_;
    (__return_storage_ptr__->first).bucket_index_ = p.first.bucket_index_;
    bVar2 = false;
  }
  __return_storage_ptr__->second = bVar2;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert(const KeyValuePair& kv) {
      std::pair<const_iterator, size_type> p = FindHelper(kv.key());
      // Case 1: key was already present.
      if (p.first.node_ != NULL)
        return std::make_pair(iterator(p.first), false);
      // Case 2: insert.
      if (ResizeIfLoadIsOutOfRange(num_elements_ + 1)) {
        p = FindHelper(kv.key());
      }
      const size_type b = p.second;  // bucket number
      Node* node = Alloc<Node>(1);
      alloc_.construct(&node->kv, kv);
      iterator result = InsertUnique(b, node);
      ++num_elements_;
      return std::make_pair(result, true);
    }